

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O2

void duckdb::PrimitiveColumnWriter::WriteLevels
               (WriteStream *temp_writer,unsafe_vector<uint16_t> *levels,idx_t max_value,
               idx_t offset,idx_t count,optional_idx null_count)

{
  byte bVar1;
  Allocator *pAVar2;
  idx_t iVar3;
  unsigned_long val;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  idx_t i;
  uint local_894;
  WriteStream *local_890;
  optional_idx null_count_local;
  MemoryStream intermediate_stream;
  RleBpEncoder rle_encoder;
  
  if (count == 0) {
    return;
  }
  if ((levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_890 = temp_writer;
    null_count_local = null_count;
    bVar1 = RleBpDecoder::ComputeBitWidth(max_value);
    rle_encoder.bit_width = (uint32_t)bVar1;
    rle_encoder.byte_width = rle_encoder.bit_width + 7 >> 3;
    memset(rle_encoder.bp_block,0,0x800);
    pAVar2 = (Allocator *)duckdb::Allocator::DefaultAllocator();
    duckdb::MemoryStream::MemoryStream(&intermediate_stream,pAVar2,0x200);
    rle_encoder.rle_count = 0;
    rle_encoder.bp_block_count = 0;
    if ((null_count.index == 0xffffffffffffffff) ||
       (iVar3 = optional_idx::GetIndex(&null_count_local), iVar3 != 0)) {
      uVar6 = count + offset;
      for (; offset < uVar6; offset = offset + 1) {
        local_894 = (uint)(levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[offset];
        RleBpEncoder::WriteValue(&rle_encoder,(WriteStream *)&intermediate_stream,&local_894);
      }
    }
    else {
      RleBpEncoder::WriteMany
                (&rle_encoder,(WriteStream *)&intermediate_stream,
                 (uint)*(levels->super_vector<unsigned_short,_std::allocator<unsigned_short>_>).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,count);
    }
    RleBpEncoder::WriteRun(&rle_encoder,(WriteStream *)&intermediate_stream);
    val = duckdb::MemoryStream::GetPosition();
    local_894 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
    (*(code *)**(undefined8 **)local_890)(local_890,&local_894,4);
    uVar4 = duckdb::MemoryStream::GetData();
    uVar5 = duckdb::MemoryStream::GetPosition();
    (*(code *)**(undefined8 **)local_890)(local_890,uVar4,uVar5);
    duckdb::MemoryStream::~MemoryStream(&intermediate_stream);
    return;
  }
  return;
}

Assistant:

void PrimitiveColumnWriter::WriteLevels(WriteStream &temp_writer, const unsafe_vector<uint16_t> &levels,
                                        idx_t max_value, idx_t offset, idx_t count, optional_idx null_count) {
	if (levels.empty() || count == 0) {
		return;
	}

	// write the levels using the RLE-BP encoding
	const auto bit_width = RleBpDecoder::ComputeBitWidth((max_value));
	RleBpEncoder rle_encoder(bit_width);

	// have to write to an intermediate stream first because we need to know the size
	MemoryStream intermediate_stream(Allocator::DefaultAllocator());

	rle_encoder.BeginWrite();
	if (null_count.IsValid() && null_count.GetIndex() == 0) {
		// Fast path: no nulls
		rle_encoder.WriteMany(intermediate_stream, levels[0], count);
	} else {
		for (idx_t i = offset; i < offset + count; i++) {
			rle_encoder.WriteValue(intermediate_stream, levels[i]);
		}
	}
	rle_encoder.FinishWrite(intermediate_stream);

	// start off by writing the byte count as a uint32_t
	temp_writer.Write(NumericCast<uint32_t>(intermediate_stream.GetPosition()));
	// copy over the written data
	temp_writer.WriteData(intermediate_stream.GetData(), intermediate_stream.GetPosition());
}